

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O3

agc_type_t agc_type_from_str(char *str)

{
  int iVar1;
  int i;
  long lVar2;
  char **ppcVar3;
  
  ppcVar3 = agc_type_str;
  lVar2 = 0;
  do {
    iVar1 = strcmp(str,*ppcVar3);
    if (iVar1 == 0) {
      return (agc_type_t)lVar2;
    }
    lVar2 = lVar2 + 1;
    ppcVar3 = ppcVar3 + 1;
  } while (lVar2 != 4);
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/agc.c"
          ,0x57,"Unknown AGC type \'%s\'\n",str);
  exit(1);
}

Assistant:

agc_type_t
agc_type_from_str(const char *str)
{
    int i;

    for (i = 0; i < n_agc_type_str; ++i) {
        if (0 == strcmp(str, agc_type_str[i]))
            return (agc_type_t)i;
    }
    E_FATAL("Unknown AGC type '%s'\n", str);
    return AGC_NONE;
}